

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

void __thiscall TRootHandler_MNDX::~TRootHandler_MNDX(TRootHandler_MNDX *this)

{
  TMndxMarFile *this_00;
  LPBYTE __ptr;
  long lVar1;
  ulong uVar2;
  
  (this->super_TRootHandler)._vptr_TRootHandler = (_func_int **)&PTR__TRootHandler_MNDX_0012d9b0;
  lVar1 = 10;
  do {
    this_00 = *(TMndxMarFile **)((this->MndxInfo).RootFileName + lVar1 * 8 + -0x10);
    if (this_00 != (TMndxMarFile *)0x0) {
      TMndxMarFile::~TMndxMarFile(this_00);
    }
    operator_delete(this_00,0x18);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd);
  if (this->ppValidEntries != (PMNDX_ROOT_ENTRY *)0x0) {
    free(this->ppValidEntries);
  }
  if (this->pMndxEntries != (PMNDX_ROOT_ENTRY)0x0) {
    free(this->pMndxEntries);
  }
  if ((this->Packages).m_ItemCount != 0) {
    uVar2 = 0;
    do {
      free(*(void **)((this->Packages).m_pItemArray + (this->Packages).m_ItemSize * uVar2));
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->Packages).m_ItemCount);
  }
  __ptr = (this->Packages).m_pItemArray;
  if (__ptr != (LPBYTE)0x0) {
    free(__ptr);
  }
  (this->Packages).m_pItemArray = (LPBYTE)0x0;
  (this->Packages).m_ItemCountMax = 0;
  (this->Packages).m_ItemCount = 0;
  TRootHandler::~TRootHandler(&this->super_TRootHandler);
  return;
}

Assistant:

~TRootHandler_MNDX()
    {
        PMNDX_PACKAGE pPackage;
        size_t i;

        for(i = 0; i < MAX_MAR_FILES; i++)
            delete MndxInfo.MarFiles[i];
        if(ppValidEntries != NULL)
            CASC_FREE(ppValidEntries);
        if(pMndxEntries != NULL)
            CASC_FREE(pMndxEntries);

        for(i = 0; i < Packages.ItemCount(); i++)
        {
            pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);
            CASC_FREE(pPackage->szFileName);
        }
        Packages.Free();
    }